

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::util_criticalsection::test_method(util_criticalsection *this)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  RecursiveMutex cs;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> lockTest;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock5;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  assertion_result *in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe78;
  const_string *in_stack_fffffffffffffe80;
  const_string *pcVar3;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  lazy_ostream *in_stack_fffffffffffffe90;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffe98;
  const_string local_130;
  lazy_ostream local_120 [2];
  assertion_result local_100 [2];
  const_string local_c8 [2];
  lazy_ostream local_a8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AnnotatedMixin<std::recursive_mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe58);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe58);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffe98,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe90,
             (char *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
             (char *)in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe78 >> 0x18,0));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe58);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe58);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffe98,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe90,
             (char *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
             (char *)in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe78 >> 0x18,0));
  bVar2 = UniqueLock::operator_cast_to_bool
                    ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe58)
  ;
  if (bVar2) {
    do {
      pcVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe68,
                 (pointer)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                 (unsigned_long)in_stack_fffffffffffffe58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)pcVar3,(const_string *)in_stack_fffffffffffffe90,
                 CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                 in_stack_fffffffffffffe80);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffffe68,(bool)in_stack_fffffffffffffe67);
      in_stack_fffffffffffffe90 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe68,
                 (pointer)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                 (unsigned_long)in_stack_fffffffffffffe58);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                 (basic_cstring<const_char> *)in_stack_fffffffffffffe58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe68,
                 (pointer)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                 (unsigned_long)in_stack_fffffffffffffe58);
      in_stack_fffffffffffffe58 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&stack0xffffffffffffff78,&local_a8,local_c8,0x86,CHECK,
                 CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffffe58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffe58);
      in_stack_fffffffffffffe8f = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffffe8f);
  }
  else {
    do {
      pcVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe68,
                 (pointer)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                 (unsigned_long)in_stack_fffffffffffffe58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffe98,
                 (const_string *)in_stack_fffffffffffffe90,
                 CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),pcVar3);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffffe68,(bool)in_stack_fffffffffffffe67);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                 (char (*) [21])in_stack_fffffffffffffe58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe68,
                 (pointer)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                 (unsigned_long)in_stack_fffffffffffffe58);
      in_stack_fffffffffffffe58 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_100,local_120,&local_130,0x8a,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>
                          *)in_stack_fffffffffffffe58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffe58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe58);
  AnnotatedMixin<std::recursive_mutex>::~AnnotatedMixin
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe58);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(util_criticalsection)
{
    RecursiveMutex cs;

    do {
        LOCK(cs);
        break;

        BOOST_ERROR("break was swallowed!");
    } while(0);

    do {
        TRY_LOCK(cs, lockTest);
        if (lockTest) {
            BOOST_CHECK(true); // Needed to suppress "Test case [...] did not check any assertions"
            break;
        }

        BOOST_ERROR("break was swallowed!");
    } while(0);
}